

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  ZSTD_compressionParameters cParams;
  ZSTD_parameters ZVar1;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_strategy ZVar3;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U64 pledgedSrcSize;
  unsigned_long_long pss_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  if ((pss == 0) && (params.fParams.contentSizeFlag == 0)) {
    pss = 0xffffffffffffffff;
  }
  ZVar3 = (ZSTD_strategy)pss;
  zcs_local = (ZSTD_CStream *)ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar2 = ERR_isError((size_t)zcs_local);
  if (uVar2 == 0) {
    zcs_local = (ZSTD_CStream *)ZSTD_CCtx_setPledgedSrcSize(zcs,pss);
    uVar2 = ERR_isError((size_t)zcs_local);
    ZVar1 = params;
    if (uVar2 == 0) {
      cParams.targetLength = in_stack_ffffffffffffff94;
      cParams.windowLog = params.cParams.hashLog;
      cParams.chainLog = params.cParams.searchLog;
      cParams.hashLog = params.cParams.minMatch;
      cParams.searchLog = params.cParams.targetLength;
      cParams.minMatch = params.cParams.strategy;
      cParams.strategy = ZVar3;
      params = ZVar1;
      zcs_local = (ZSTD_CStream *)ZSTD_checkCParams(cParams);
      uVar2 = ERR_isError((size_t)zcs_local);
      if (uVar2 == 0) {
        ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams,&params);
        zcs_local = (ZSTD_CStream *)ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
        uVar2 = ERR_isError((size_t)zcs_local);
        if (uVar2 == 0) {
          zcs_local = (ZSTD_CStream *)0x0;
        }
      }
    }
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}